

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O1

void printThumbAddrModeImm5SOperand(MCInst *MI,uint Op,SStream *O,uint Scale)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  _Bool _Var4;
  uint uVar5;
  MCOperand *op;
  MCOperand *op_00;
  char *pcVar6;
  int64_t iVar7;
  undefined4 in_register_00000034;
  SStream *O_00;
  
  O_00 = (SStream *)CONCAT44(in_register_00000034,Op);
  op = MCInst_getOperand(MI,1);
  op_00 = MCInst_getOperand(MI,2);
  _Var4 = MCOperand_isReg(op);
  if (_Var4) {
    SStream_concat0(O_00,"[");
    set_mem_access(MI,true);
    pcVar2 = MI->csh;
    uVar5 = MCOperand_getReg(op);
    pcVar6 = (*pcVar2->get_regname)(uVar5);
    SStream_concat0(O_00,pcVar6);
    if (MI->csh->detail != CS_OPT_OFF) {
      uVar5 = MCOperand_getReg(op);
      pcVar3 = MI->flat_insn->detail;
      *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar5;
    }
    iVar7 = MCOperand_getImm(op_00);
    if ((int)iVar7 != 0) {
      uVar5 = (int)iVar7 * (int)O;
      SStream_concat0(O_00,", ");
      pcVar6 = ", #%u";
      if (9 < uVar5) {
        pcVar6 = ", #0x%x";
      }
      SStream_concat(O_00,pcVar6 + 2,(ulong)uVar5);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar3 = MI->flat_insn->detail;
        *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x52) = uVar5;
      }
    }
    SStream_concat0(O_00,"]");
    if (MI->csh->detail == CS_OPT_ON) {
      MI->csh->doing_mem = false;
      puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
    return;
  }
  printOperand(MI,1,O_00);
  return;
}

Assistant:

static void printThumbAddrModeImm5SOperand(MCInst *MI, unsigned Op, SStream *O,
		unsigned Scale)
{
	MCOperand *MO1 = MCInst_getOperand(MI, Op);
	MCOperand *MO2 = MCInst_getOperand(MI, Op + 1);
	unsigned ImmOffs, tmp;

	if (!MCOperand_isReg(MO1)) {   // FIXME: This is for CP entries, but isn't right.
		printOperand(MI, Op, O);
		return;
	}

	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);
	ImmOffs = (unsigned int)MCOperand_getImm(MO2);
	if (ImmOffs) {
		tmp = ImmOffs * Scale;
		SStream_concat0(O, ", ");
		if (tmp > HEX_THRESHOLD)
			SStream_concat(O, "#0x%x", tmp);
		else
			SStream_concat(O, "#%u", tmp);
		if (MI->csh->detail)
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = tmp;
	}
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}